

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSim3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Int_t *p;
  int iVar1;
  Abc_NtkType_t AVar2;
  Abc_NtkFunc_t AVar3;
  int iVar4;
  Abc_Obj_t *pObj_00;
  char *pcVar5;
  char *local_e8;
  Vec_Int_t *vInit;
  Abc_Obj_t *pObj;
  char *pcStack_b0;
  int c;
  char *pLogFileName;
  Vec_Ptr_t *vSeqModelVec;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkRes;
  Ssw_RarPars_t *pPars;
  Ssw_RarPars_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtkRes = (Abc_Ntk_t *)&pPars;
  Pars.pFuncOnFail = (_func_int_int_Abc_Cex_t_ptr *)argv;
  vSeqModelVec = (Vec_Ptr_t *)Abc_FrameReadNtk(pAbc);
  pcStack_b0 = (char *)0x0;
  Ssw_RarSetDefaultParams((Ssw_RarPars_t *)pNtkRes);
  Extra_UtilGetoptReset();
LAB_00289daf:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars.pFuncOnFail,"FWBRSNTGLadivzh");
    if (iVar1 == -1) {
      if (vSeqModelVec == (Vec_Ptr_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash((Abc_Ntk_t *)vSeqModelVec);
      if (iVar1 != 0) {
        iVar1 = Abc_NtkLatchNum((Abc_Ntk_t *)vSeqModelVec);
        if (iVar1 == 0) {
          Abc_Print(-1,"Only works for sequential networks.\n");
          return 1;
        }
        if (vSeqModelVec[0x13].pArray != (void **)0x0) {
          free(vSeqModelVec[0x13].pArray);
          vSeqModelVec[0x13].pArray = (void **)0x0;
        }
        iVar1 = Abc_NtkDarSeqSim3((Abc_Ntk_t *)vSeqModelVec,(Ssw_RarPars_t *)pNtkRes);
        pAbc->Status = iVar1;
        Abc_FrameReplaceCex(pAbc,(Abc_Cex_t **)&vSeqModelVec[0x13].pArray);
        pLogFileName = *(char **)(vSeqModelVec + 0x14);
        vSeqModelVec[0x14].nCap = 0;
        vSeqModelVec[0x14].nSize = 0;
        if ((*(int *)((long)&pNtkRes->vObjs + 4) != 0) && (pAbc->pNtkCur->pData != (void *)0x0)) {
          p = (Vec_Int_t *)pAbc->pNtkCur->pData;
          pAbc->pNtkCur->pData = (void *)0x0;
          for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pAbc->pNtkCur->vBoxes), pObj._4_4_ < iVar1;
              pObj._4_4_ = pObj._4_4_ + 1) {
            pObj_00 = Abc_NtkBox(pAbc->pNtkCur,pObj._4_4_);
            iVar1 = Abc_ObjIsLatch(pObj_00);
            if ((iVar1 != 0) && (iVar1 = Vec_IntEntry(p,pObj._4_4_), iVar1 != 0)) {
              Abc_LatchSetInit1(pObj_00);
            }
          }
          Vec_IntFree(p);
          pNtk = Abc_NtkRestrashZero(pAbc->pNtkCur,0);
          if (pNtk == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"Removing SAT outputs has failed.\n");
            return 1;
          }
          Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
          vSeqModelVec = (Vec_Ptr_t *)Abc_FrameReadNtk(pAbc);
        }
        if ((*(int *)&pNtkRes->vObjs != 0) && (*(int *)((long)&pNtkRes->vPos + 4) != 0)) {
          if (pLogFileName == (char *)0x0) {
            Abc_Print(1,"The array of counter-examples is not available.\n");
          }
          else {
            iVar1 = Vec_PtrSize((Vec_Ptr_t *)pLogFileName);
            iVar4 = Abc_NtkPoNum((Abc_Ntk_t *)vSeqModelVec);
            if (iVar1 == iVar4) {
              Abc_NtkDropSatOutputs
                        ((Abc_Ntk_t *)vSeqModelVec,(Vec_Ptr_t *)pLogFileName,*(int *)&pNtkRes->vPis)
              ;
              pNtk = Abc_NtkDarLatchSweep((Abc_Ntk_t *)vSeqModelVec,1,1,1,0,-1,-1,0,0);
              if (pNtk == (Abc_Ntk_t *)0x0) {
                Abc_Print(-1,"Removing SAT outputs has failed.\n");
                return 1;
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
            }
            else {
              Abc_Print(1,"The array size does not match the number of outputs.\n");
            }
          }
        }
        if (pLogFileName != (char *)0x0) {
          Abc_FrameReplaceCexVec(pAbc,(Vec_Ptr_t **)&pLogFileName);
          pAbc->nFrames = -1;
        }
        if (pcStack_b0 != (char *)0x0) {
          Abc_NtkWriteLogFile(pcStack_b0,pAbc->pCex,pAbc->Status,pAbc->nFrames,"sim3");
        }
        return 0;
      }
      Abc_Print(-1,"Only works for strashed networks.\n");
      return 1;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      iVar1 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->pName = iVar1;
      AVar2 = *(Abc_NtkType_t *)&pNtkRes->pName;
      break;
    default:
      goto LAB_0028a686;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      AVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      pNtkRes->ntkType = AVar2;
      AVar2 = pNtkRes->ntkType;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      iVar1 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->pManName + 4) = iVar1;
      AVar2 = *(Abc_NtkType_t *)((long)&pNtkRes->pManName + 4);
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_0028a686;
      }
      pcStack_b0 = *(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00289daf;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      iVar1 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->pSpec + 4) = iVar1;
      AVar2 = *(Abc_NtkType_t *)((long)&pNtkRes->pSpec + 4);
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      iVar1 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->pName + 4) = iVar1;
      AVar2 = *(Abc_NtkType_t *)((long)&pNtkRes->pName + 4);
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      iVar1 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->pSpec = iVar1;
      AVar2 = *(Abc_NtkType_t *)&pNtkRes->pSpec;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      iVar1 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->pManName = iVar1;
      AVar2 = *(Abc_NtkType_t *)&pNtkRes->pManName;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_0028a686;
      }
      AVar3 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      pNtkRes->ntkFunc = AVar3;
      AVar2 = pNtkRes->ntkFunc;
      break;
    case 0x61:
      *(uint *)&pNtkRes->vObjs = *(uint *)&pNtkRes->vObjs ^ 1;
      goto LAB_00289daf;
    case 100:
      *(uint *)((long)&pNtkRes->vPos + 4) = *(uint *)((long)&pNtkRes->vPos + 4) ^ 1;
      goto LAB_00289daf;
    case 0x68:
      goto LAB_0028a686;
    case 0x69:
      *(uint *)((long)&pNtkRes->vObjs + 4) = *(uint *)((long)&pNtkRes->vObjs + 4) ^ 1;
      goto LAB_00289daf;
    case 0x76:
      *(uint *)&pNtkRes->vPis = *(uint *)&pNtkRes->vPis ^ 1;
      goto LAB_00289daf;
    case 0x7a:
      *(uint *)((long)&pNtkRes->vPis + 4) = *(uint *)((long)&pNtkRes->vPis + 4) ^ 1;
      goto LAB_00289daf;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)AVar2 < 0) {
LAB_0028a686:
      Abc_Print(-2,"usage: sim3 [-FWBRSNTG num] [-L file] [-advzh]\n");
      Abc_Print(-2,"\t         performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
                (ulong)pNtkRes->ntkType);
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)pNtkRes->ntkFunc);
      Abc_Print(-2,"\t-B num : the number of flops in one bin [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->pName);
      Abc_Print(-2,"\t-R num : the number of simulation rounds [default = %d]\n",
                (ulong)*(uint *)((long)&pNtkRes->pName + 4));
      Abc_Print(-2,"\t-S num : the number of rounds before a restart [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->pSpec);
      Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
                (ulong)*(uint *)((long)&pNtkRes->pSpec + 4));
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->pManName);
      Abc_Print(-2,
                "\t-G num : approximate runtime gap in seconds since the last CEX [default = %d]\n",
                (ulong)*(uint *)((long)&pNtkRes->pManName + 4));
      if (pcStack_b0 == (char *)0x0) {
        local_e8 = "no logging";
      }
      else {
        local_e8 = pcStack_b0;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",local_e8);
      pcVar5 = "no";
      if (*(int *)&pNtkRes->vObjs != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,
                "\t-a     : toggle solving all outputs (do not stop when one is SAT) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "no";
      if (*(int *)((long)&pNtkRes->vPos + 4) != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",pcVar5
               );
      pcVar5 = "no";
      if (*(int *)&pNtkRes->vPis != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-i     : toggle changing init state to a last rare state [default = %s]\n",
                pcVar5);
      pcVar5 = "no";
      if (*(int *)&pNtkRes->vPis != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (*(int *)((long)&pNtkRes->vPis + 4) != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-z     : toggle suppressing report about solved outputs [default = %s]\n",
                pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSim3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkDarSeqSim3( Abc_Ntk_t * pNtk, Ssw_RarPars_t * pPars );
    Ssw_RarPars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    Vec_Ptr_t * vSeqModelVec;
    char * pLogFileName = NULL;
    int c;
    Ssw_RarSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWBRSNTGLadivzh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBinSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBinSize < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestart < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'a':
            pPars->fSolveAll ^= 1;
            break;
        case 'd':
            pPars->fDropSatOuts ^= 1;
            break;
        case 'i':
            pPars->fSetLastState ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'z':
            pPars->fNotVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "Only works for sequential networks.\n" );
        return 1;
    }
    ABC_FREE( pNtk->pSeqModel );
    pAbc->Status = Abc_NtkDarSeqSim3( pNtk, pPars );
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    vSeqModelVec = pNtk->vSeqModelVec;  pNtk->vSeqModelVec = NULL;
    if ( pPars->fSetLastState && pAbc->pNtkCur->pData )
    {
        Abc_Obj_t * pObj;
        Vec_Int_t * vInit = (Vec_Int_t *)pAbc->pNtkCur->pData;
        pAbc->pNtkCur->pData = NULL;
        Abc_NtkForEachLatch( pAbc->pNtkCur, pObj, c )
            if ( Vec_IntEntry(vInit, c) )
                Abc_LatchSetInit1( pObj );
        Vec_IntFree( vInit );
        pNtkRes = Abc_NtkRestrashZero( pAbc->pNtkCur, 0 );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Removing SAT outputs has failed.\n" );
            return 1;
        }
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        pNtk = Abc_FrameReadNtk(pAbc);
    }
    if ( pPars->fSolveAll && pPars->fDropSatOuts )
    {
        if ( vSeqModelVec == NULL )
            Abc_Print( 1,"The array of counter-examples is not available.\n" );
        else if ( Vec_PtrSize(vSeqModelVec) != Abc_NtkPoNum(pNtk) )
            Abc_Print( 1,"The array size does not match the number of outputs.\n" );
        else
        {
            extern void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose );
            Abc_NtkDropSatOutputs( pNtk, vSeqModelVec, pPars->fVerbose );
            pNtkRes = Abc_NtkDarLatchSweep( pNtk, 1, 1, 1, 0, -1, -1, 0, 0 );
            if ( pNtkRes == NULL )
            {
                Abc_Print( -1, "Removing SAT outputs has failed.\n" );
                return 1;
            }
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        }
    }
    if ( vSeqModelVec )
    {
        Abc_FrameReplaceCexVec( pAbc, &vSeqModelVec );
        pAbc->nFrames = -1;
    }
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "sim3" );
    return 0;

usage:
    Abc_Print( -2, "usage: sim3 [-FWBRSNTG num] [-L file] [-advzh]\n" );
    Abc_Print( -2, "\t         performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n",                         pPars->nFrames );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n",                          pPars->nWords );
    Abc_Print( -2, "\t-B num : the number of flops in one bin [default = %d]\n",                           pPars->nBinSize );
    Abc_Print( -2, "\t-R num : the number of simulation rounds [default = %d]\n",                          pPars->nRounds );
    Abc_Print( -2, "\t-S num : the number of rounds before a restart [default = %d]\n",                    pPars->nRestart );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",                    pPars->nRandSeed );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n",                     pPars->TimeOut );
    Abc_Print( -2, "\t-G num : approximate runtime gap in seconds since the last CEX [default = %d]\n",    pPars->TimeOutGap );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n",                                          pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-a     : toggle solving all outputs (do not stop when one is SAT) [default = %s]\n", pPars->fSolveAll?    "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",             pPars->fDropSatOuts? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle changing init state to a last rare state [default = %s]\n",          pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle suppressing report about solved outputs [default = %s]\n",           pPars->fNotVerbose?  "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}